

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsDynamicIndexing1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  string expression_type_declarations;
  string shader_source;
  string expressions [4];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"uniform int a;\nconst int b = 0;\nint c = 0;\nfloat x[2][2];\n",""
            );
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"a","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"b","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"c","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"0 + 1","");
  local_d8 = local_c8;
  local_d0 = 0;
  local_c8[0] = 0;
  local_e0 = 0;
  std::__cxx11::string::_M_assign((string *)&local_d8);
  std::__cxx11::string::_M_append((char *)&local_d8,shader_start_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_d8);
  std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[0]);
  std::__cxx11::string::append((char *)&local_d8);
  std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8[0]);
  std::__cxx11::string::append((char *)&local_d8);
  puVar1 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&local_d8);
    break;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&local_d8,*puVar1);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xd1b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&local_d8,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01ac9e78 + *(int *)(&DAT_01ac9e78 + (ulong)tested_shader_type * 4)))();
  return;
}

Assistant:

void ExpressionsDynamicIndexing1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string expression_type_declarations = "uniform int a;\n"
											   "const int b = 0;\n"
											   "int c = 0;\n"
											   "float x[2][2];\n";

	std::string expressions[] = { "a", "b", "c", "0 + 1" };
	std::string shader_source;

	for (size_t write_index = 0; write_index < sizeof(expressions) / sizeof(expressions[0]); write_index++)
	{
		for (size_t read_index = 0; read_index < sizeof(expressions) / sizeof(expressions[0]); read_index++)
		{
			shader_source = expression_type_declarations;
			shader_source += shader_start;
			shader_source += "    x[";
			shader_source += expressions[write_index];
			shader_source += "][";
			shader_source += expressions[read_index];
			shader_source += "] = 1.0;\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* for (int read_index = 0; ...) */
	}	 /* for (int write_index = 0; ...) */
}